

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

int __thiscall server::gobang::quit(gobang *this,player *role)

{
  iterator iVar1;
  int local_44;
  char local_40 [32];
  
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_server::player_*>,_std::_Select1st<std::pair<const_int,_server::player_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_server::player_*>_>_>
          ::find(&(this->players_)._M_t,&role->userid_);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->players_)._M_t._M_impl.super__Rb_tree_header) {
    role->game_ = (gobang *)0x0;
    std::
    _Rb_tree<int,_std::pair<const_int,_server::player_*>,_std::_Select1st<std::pair<const_int,_server::player_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_server::player_*>_>_>
    ::erase(&(this->players_)._M_t,&role->userid_);
    local_40[0x10] = '\0';
    local_40[0x11] = '\0';
    local_40[0x12] = '\0';
    local_40[0x13] = '\0';
    local_40[0x14] = '\0';
    local_40[0x15] = '\0';
    local_40[0x16] = '\0';
    local_40[0x17] = '\0';
    local_40[0x18] = '\0';
    local_40[0x19] = '\0';
    local_40[0x1a] = '\0';
    local_40[0x1b] = '\0';
    local_40[0x1c] = '\0';
    local_40[0x1d] = '\0';
    local_40[0x1e] = '\0';
    local_40[0x1f] = '\0';
    local_40[0] = '\0';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    local_40[8] = '\0';
    local_40[9] = '\0';
    local_40[10] = '\0';
    local_40[0xb] = '\0';
    local_40[0xc] = '\0';
    local_40[0xd] = '\0';
    local_40[0xe] = '\0';
    local_40[0xf] = '\0';
    local_44 = role->userid_;
    strcpy(local_40,role->name_);
    broadcast(this,6,&local_44,0x24);
    if ((this->player1 == role) || (this->player2 == role)) {
      this->player1 = (player *)0x0;
      this->player2 = (player *)0x0;
      this->state_ = 3;
      sync_status(this,(player *)0x0);
    }
    return 0;
  }
  __assert_fail("players_.find(role->userid_) != players_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/sample/server.cpp"
                ,0x4d,"int server::gobang::quit(player *)");
}

Assistant:

int quit(player* role) {
            assert(players_.find(role->userid_) != players_.end());
            role->set_game(nullptr);
            players_.erase(role->userid_);

            quit_ntf ntf = { 0 };
            ntf.userid = role->userid_;
            strcpy(ntf.name, role->name_);
            broadcast(MSG_QUIT_NTF, &ntf, sizeof(ntf));

            if (role == player1 || role == player2) {
                player1 = player2 = nullptr;
                state_ = STATE_ABORTED;
                sync_status();
            }

            return 0;
        }